

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeINTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  uint uVar1;
  int iVar2;
  WhereLoop *pWVar3;
  Index *pIVar4;
  Expr *p;
  Vdbe *p_00;
  InLoop *__src;
  size_t __n;
  sqlite3 *db;
  Select *pSVar5;
  ExprList *pList;
  Expr *pEVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  u32 uVar10;
  long lVar11;
  ulong uVar12;
  InLoop *pIVar13;
  Expr *pX;
  ExprList *pEList;
  int iVar14;
  ulong uVar15;
  long lVar16;
  anon_union_8_2_a01b6dbf_for_x *paVar17;
  ExprList *pList_00;
  uint uVar18;
  long lVar19;
  long in_FS_OFFSET;
  int local_d8;
  ExprList *local_b0;
  int *local_a8;
  byte local_70;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar3 = pLevel->pWLoop;
  if ((((pWVar3->wsFlags & 0x400) == 0) &&
      (pIVar4 = (pWVar3->u).btree.pIndex, pIVar4 != (Index *)0x0)) &&
     (pIVar4->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  p = pTerm->pExpr;
  p_00 = pParse->pVdbe;
  lVar11 = (long)iEq;
  uVar12 = 0;
  uVar15 = 0;
  if (0 < iEq) {
    uVar15 = (ulong)(uint)iEq;
  }
  for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    if ((pWVar3->aLTerm[uVar12] != (WhereTerm *)0x0) && (pWVar3->aLTerm[uVar12]->pExpr == p)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        disableTerm(pLevel,pTerm);
        return;
      }
      goto LAB_0018f9c8;
    }
  }
  uVar18 = 0;
  for (lVar16 = lVar11; lVar16 < (long)(ulong)pWVar3->nLTerm; lVar16 = lVar16 + 1) {
    uVar18 = uVar18 + (pWVar3->aLTerm[lVar16]->pExpr == p);
  }
  local_3c = 0;
  if (((p->flags >> 0xc & 1) == 0) || (((p->x).pSelect)->pEList->nExpr == 1)) {
    local_a8 = (int *)0x0;
LAB_0018f3c0:
    local_d8 = sqlite3FindInIndex(pParse,p,4,(int *)0x0,local_a8,&local_3c);
  }
  else {
    if (((p->flags >> 0x19 & 1) != 0) && (p->iTable != 0)) {
      uVar9 = sqlite3ExprVectorSize(p->pLeft);
      if ((int)uVar9 < (int)uVar18) {
        uVar9 = uVar18;
      }
      local_a8 = (int *)sqlite3DbMallocZero(pParse->db,(ulong)uVar9 * 4);
      goto LAB_0018f3c0;
    }
    db = pParse->db;
    local_a8 = (int *)0x0;
    pX = sqlite3ExprDup(db,p,0);
    local_d8 = 5;
    if (db->mallocFailed == '\0') {
      paVar17 = &pX->x;
      while (pSVar5 = paVar17->pSelect, pSVar5 != (Select *)0x0) {
        if (pSVar5 == (Select *)(pX->x).pList) {
          pList_00 = (pX->pLeft->x).pList;
        }
        else {
          pList_00 = (ExprList *)0x0;
        }
        pList = pSVar5->pEList;
        pEList = (ExprList *)0x0;
        local_b0 = (ExprList *)0x0;
        for (lVar16 = lVar11; lVar16 < (long)(ulong)pWVar3->nLTerm; lVar16 = lVar16 + 1) {
          if (pWVar3->aLTerm[lVar16]->pExpr == p) {
            iVar2 = (pWVar3->aLTerm[lVar16]->u).x.iField;
            pEVar6 = pList->a[(long)iVar2 + -1].pExpr;
            if (pEVar6 != (Expr *)0x0) {
              pEList = sqlite3ExprListAppend(pParse,pEList,pEVar6);
              pList->a[(long)iVar2 + -1].pExpr = (Expr *)0x0;
              if (pEList != (ExprList *)0x0) {
                pEList->a[(long)pEList->nExpr + -1].u.x.iOrderByCol = (u16)iVar2;
              }
              if (pList_00 != (ExprList *)0x0) {
                local_b0 = sqlite3ExprListAppend
                                     (pParse,local_b0,pList_00->a[(long)iVar2 + -1].pExpr);
                pList_00->a[(long)iVar2 + -1].pExpr = (Expr *)0x0;
              }
            }
          }
        }
        sqlite3ExprListDelete(db,pList);
        if (pList_00 != (ExprList *)0x0) {
          exprListDeleteNN(db,pList_00);
          (pX->pLeft->x).pList = local_b0;
        }
        pSVar5->pEList = pEList;
        uVar10 = pParse->nSelect + 1;
        pParse->nSelect = uVar10;
        pSVar5->selId = uVar10;
        if ((local_b0 != (ExprList *)0x0) && (local_b0->nExpr == 1)) {
          pEVar6 = local_b0->a[0].pExpr;
          local_b0->a[0].pExpr = (Expr *)0x0;
          sqlite3ExprDelete(db,pX->pLeft);
          pX->pLeft = pEVar6;
        }
        if (pEList != (ExprList *)0x0) {
          adjustOrderByCol(pSVar5->pOrderBy,pEList);
          adjustOrderByCol(pSVar5->pGroupBy,pEList);
          uVar12 = (ulong)(uint)pEList->nExpr;
          if (pEList->nExpr < 1) {
            uVar12 = 0;
          }
          for (lVar16 = 0; uVar12 * 0x18 - lVar16 != 0; lVar16 = lVar16 + 0x18) {
            *(undefined2 *)((long)&pEList->a[0].u + lVar16) = 0;
          }
        }
        paVar17 = (anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pPrior;
      }
      if (db->mallocFailed == '\0') {
        local_a8 = (int *)sqlite3DbMallocZero(pParse->db,(ulong)uVar18 << 2);
        local_d8 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0,local_a8,&local_3c);
        p->iTable = local_3c;
      }
      else {
        local_a8 = (int *)0x0;
      }
    }
    sqlite3ExprDelete(db,pX);
  }
  iVar2 = local_3c;
  uVar9 = (uint)(bRev == 0);
  if (local_d8 != 4) {
    uVar9 = bRev;
  }
  sqlite3VdbeAddOp2(p_00,(uint)(uVar9 == 0) * 4 + 0x20,local_3c,0);
  uVar1 = pWVar3->wsFlags;
  pWVar3->wsFlags = uVar1 | 0x800;
  if ((pLevel->u).in.nIn == 0) {
    iVar14 = pParse->nLabel + -1;
    pParse->nLabel = iVar14;
    pLevel->addrNxt = iVar14;
  }
  if ((0 < iEq) && ((uVar1 & 0x100000) == 0)) {
    pWVar3->wsFlags = uVar1 | 0x40800;
  }
  lVar19 = (long)(pLevel->u).in.nIn;
  lVar16 = (int)uVar18 + lVar19;
  (pLevel->u).in.nIn = (int)lVar16;
  __src = (pLevel->u).in.aInLoop;
  pIVar13 = (InLoop *)sqlite3WhereMalloc(pTerm->pWC->pWInfo,lVar16 * 0x14);
  if ((__src == (InLoop *)0x0) || (pIVar13 == (InLoop *)0x0)) {
    (pLevel->u).in.aInLoop = pIVar13;
    if (pIVar13 == (InLoop *)0x0) {
      (pLevel->u).in.nIn = 0;
      goto LAB_0018f6c2;
    }
  }
  else {
    __n._0_4_ = __src[-1].nPrefix;
    __n._4_1_ = __src[-1].eEndLoopOp;
    __n._5_3_ = *(undefined3 *)&__src[-1].field_0x11;
    memcpy(pIVar13,__src,__n);
    (pLevel->u).in.aInLoop = pIVar13;
  }
  pIVar13 = pIVar13 + lVar19;
  local_70 = uVar9 == 0 | 0x26;
  iVar7 = iTarget - iEq;
  lVar16 = 0;
  iVar14 = 0;
  for (; lVar11 < (long)(ulong)pWVar3->nLTerm; lVar11 = lVar11 + 1) {
    if (pWVar3->aLTerm[lVar11]->pExpr == p) {
      if (local_d8 == 1) {
        iVar8 = sqlite3VdbeAddOp2(p_00,0x87,iVar2,iTarget);
      }
      else {
        if (local_a8 == (int *)0x0) {
          iVar8 = 0;
        }
        else {
          lVar19 = (long)iVar14;
          iVar14 = iVar14 + 1;
          iVar8 = local_a8[lVar19];
        }
        iVar8 = sqlite3VdbeAddOp3(p_00,0x5e,iVar2,iVar8,iTarget);
      }
      pIVar13->addrInTop = iVar8;
      sqlite3VdbeAddOp1(p_00,0x33,iTarget);
      if (lVar16 == 0) {
        pIVar13->iCur = iVar2;
        pIVar13->eEndLoopOp = local_70;
        if (iEq < 1) {
          pIVar13->nPrefix = 0;
        }
        else {
          pIVar13->iBase = iVar7;
          pIVar13->nPrefix = iEq;
        }
      }
      else {
        pIVar13->eEndLoopOp = 0xbb;
      }
      pIVar13 = pIVar13 + 1;
    }
    lVar16 = lVar16 + -1;
    iTarget = iTarget + 1;
  }
  if ((0 < iEq) && ((pWVar3->wsFlags & 0x100400) == 0)) {
    sqlite3VdbeAddOp3(p_00,0x7d,pLevel->iIdxCur,0,iEq);
  }
LAB_0018f6c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3DbFree(pParse->db,local_a8);
    return;
  }
LAB_0018f9c8:
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void codeINTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  int eType = IN_INDEX_NOOP;
  int iTab;
  struct InLoop *pIn;
  WhereLoop *pLoop = pLevel->pWLoop;
  Vdbe *v = pParse->pVdbe;
  int i;
  int nEq = 0;
  int *aiMap = 0;

  if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
    && pLoop->u.btree.pIndex!=0
    && pLoop->u.btree.pIndex->aSortOrder[iEq]
  ){
    testcase( iEq==0 );
    testcase( bRev );
    bRev = !bRev;
  }
  assert( pX->op==TK_IN );

  for(i=0; i<iEq; i++){
    if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
      disableTerm(pLevel, pTerm);
      return;
    }
  }
  for(i=iEq;i<pLoop->nLTerm; i++){
    assert( pLoop->aLTerm[i]!=0 );
    if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
  }

  iTab = 0;
  if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
    eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
  }else{
    Expr *pExpr = pTerm->pExpr;
    if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
        pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
    }else{
      int n = sqlite3ExprVectorSize(pX->pLeft);
      aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
    }
    pX = pExpr;
  }

  if( eType==IN_INDEX_INDEX_DESC ){
    testcase( bRev );
    bRev = !bRev;
  }
  sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
  VdbeCoverageIf(v, bRev);
  VdbeCoverageIf(v, !bRev);

  assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
  pLoop->wsFlags |= WHERE_IN_ABLE;
  if( pLevel->u.in.nIn==0 ){
    pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
  }
  if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
    pLoop->wsFlags |= WHERE_IN_EARLYOUT;
  }

  i = pLevel->u.in.nIn;
  pLevel->u.in.nIn += nEq;
  pLevel->u.in.aInLoop =
     sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                         pLevel->u.in.aInLoop,
                         sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
  pIn = pLevel->u.in.aInLoop;
  if( pIn ){
    int iMap = 0;               /* Index in aiMap[] */
    pIn += i;
    for(i=iEq;i<pLoop->nLTerm; i++){
      if( pLoop->aLTerm[i]->pExpr==pX ){
        int iOut = iTarget + i - iEq;
        if( eType==IN_INDEX_ROWID ){
          pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
        }else{
          int iCol = aiMap ? aiMap[iMap++] : 0;
          pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
        }
        sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
        if( i==iEq ){
          pIn->iCur = iTab;
          pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
          if( iEq>0 ){
            pIn->iBase = iTarget - i;
            pIn->nPrefix = i;
          }else{
            pIn->nPrefix = 0;
          }
        }else{
          pIn->eEndLoopOp = OP_Noop;
        }
        pIn++;
      }
    }
    testcase( iEq>0
              && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
              && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
    if( iEq>0
     && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
    ){
      sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
    }
  }else{
    pLevel->u.in.nIn = 0;
  }
  sqlite3DbFree(pParse->db, aiMap);
}